

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators_test.cpp
# Opt level: O0

void __thiscall RenderTest_RadianceMatches_Test::TestBody(RenderTest_RadianceMatches_Test *this)

{
  bool bVar1;
  int iVar2;
  char *__filename;
  AssertHelper *this_00;
  AssertionResult gtest_ar;
  TestIntegrator *tr;
  float in_stack_000004cc;
  string *in_stack_000004d0;
  string *in_stack_fffffffffffffef8;
  int *in_stack_ffffffffffffff00;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  char *actual_expression;
  Integrator *expected_expression;
  int line;
  WithParamInterface<TestIntegrator> *in_stack_ffffffffffffff20;
  allocator<char> *file;
  Type in_stack_ffffffffffffff2c;
  allocator<char> *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  string local_a0 [24];
  Message *in_stack_ffffffffffffff78;
  undefined4 uVar3;
  AssertionResult local_78 [2];
  allocator<char> local_51;
  string local_50 [32];
  string local_30 [32];
  ParamType *local_10;
  
  local_10 = testing::WithParamInterface<TestIntegrator>::GetParam(in_stack_ffffffffffffff20);
  (*local_10->integrator->_vptr_Integrator[3])();
  file = &local_51;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  inTestDir(in_stack_fffffffffffffef8);
  CheckSceneAverage(in_stack_000004d0,in_stack_000004cc);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  expected_expression = local_10->integrator;
  if (expected_expression != (Integrator *)0x0) {
    (*expected_expression->_vptr_Integrator[1])();
  }
  uVar3 = 0;
  actual_expression = &stack0xffffffffffffff3f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  inTestDir(in_stack_fffffffffffffef8);
  __filename = (char *)std::__cxx11::string::c_str();
  iVar2 = remove(__filename);
  testing::internal::EqHelper<true>::Compare<int,int>
            ((char *)expected_expression,actual_expression,
             (int *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
             in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  line = (int)((ulong)expected_expression >> 0x20);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff40);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff3f);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_78);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff30);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x57bda6)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,(char *)file,line
               ,actual_expression);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(uVar3,iVar2),in_stack_ffffffffffffff78);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x57bdf4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x57be43);
  return;
}

Assistant:

TEST_P(RenderTest, RadianceMatches) {
    const TestIntegrator &tr = GetParam();
    tr.integrator->Render();
    CheckSceneAverage(inTestDir("test.exr"), tr.scene.expected);
    // The SpatialLightSampler class keeps a per-thread cache that
    // must be cleared out between test runs. In turn, this means that we
    // must delete the Integrator here in order to make sure that its
    // destructor runs. (This is ugly and should be fixed in a better way.)
    delete tr.integrator;

    EXPECT_EQ(0, remove(inTestDir("test.exr").c_str()));
}